

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeSIMDLoad<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,SIMDLoadOp op,int bytes)

{
  __index_type *__return_storage_ptr___00;
  Ok *pOVar1;
  bool bVar2;
  Err local_138;
  Err *local_118;
  Err *err_1;
  Result<wasm::Ok> _val_1;
  Result<wasm::Ok> arg;
  Err local_b8;
  Err *local_98;
  Err *err;
  undefined1 local_80 [8];
  MaybeResult<wasm::Ok> _val;
  MaybeResult<wasm::Ok> mem;
  int bytes_local;
  SIMDLoadOp op_local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDeclsCtx *ctx_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20);
  maybeMemidx<wasm::WATParser::ParseDeclsCtx>
            ((MaybeResult<wasm::Ok> *)__return_storage_ptr___00,ctx);
  MaybeResult<wasm::Ok>::MaybeResult
            ((MaybeResult<wasm::Ok> *)local_80,(MaybeResult<wasm::Ok> *)__return_storage_ptr___00);
  local_98 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)local_80);
  bVar2 = local_98 == (Err *)0x0;
  if (!bVar2) {
    wasm::Err::Err(&local_b8,local_98);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b8);
    wasm::Err::~Err(&local_b8);
  }
  MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)local_80);
  if (bVar2) {
    memarg<wasm::WATParser::ParseDeclsCtx>
              ((Result<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),ctx,bytes);
    Result<wasm::Ok>::Result
              ((Result<wasm::Ok> *)&err_1,
               (Result<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    local_118 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_1);
    bVar2 = local_118 == (Err *)0x0;
    if (!bVar2) {
      wasm::Err::Err(&local_138,local_118);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_138);
      wasm::Err::~Err(&local_138);
    }
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_1);
    if (bVar2) {
      pOVar1 = MaybeResult<wasm::Ok>::getPtr
                         ((MaybeResult<wasm::Ok> *)
                          ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      Result<wasm::Ok>::operator*
                ((Result<wasm::Ok> *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      NullInstrParserCtx::makeSIMDLoad
                (__return_storage_ptr__,(NullInstrParserCtx *)ctx,pos,annotations,op,pOVar1);
    }
    Result<wasm::Ok>::~Result
              ((Result<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  MaybeResult<wasm::Ok>::~MaybeResult
            ((MaybeResult<wasm::Ok> *)
             ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<> makeSIMDLoad(Ctx& ctx,
                      Index pos,
                      const std::vector<Annotation>& annotations,
                      SIMDLoadOp op,
                      int bytes) {
  auto mem = maybeMemidx(ctx);
  CHECK_ERR(mem);
  auto arg = memarg(ctx, bytes);
  CHECK_ERR(arg);
  return ctx.makeSIMDLoad(pos, annotations, op, mem.getPtr(), *arg);
}